

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedTimeZone::RuleBasedTimeZone(RuleBasedTimeZone *this,RuleBasedTimeZone *source)

{
  int iVar1;
  undefined4 extraout_var;
  UVector *pUVar2;
  UErrorCode local_28 [2];
  UErrorCode status;
  RuleBasedTimeZone *local_18;
  RuleBasedTimeZone *source_local;
  RuleBasedTimeZone *this_local;
  
  local_18 = source;
  source_local = this;
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,&source->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__RuleBasedTimeZone_0049a738;
  iVar1 = (*(local_18->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[3])();
  this->fInitialRule = (InitialTimeZoneRule *)CONCAT44(extraout_var,iVar1);
  this->fHistoricTransitions = (UVector *)0x0;
  this->fUpToDate = '\0';
  pUVar2 = copyRules(this,local_18->fHistoricRules);
  this->fHistoricRules = pUVar2;
  pUVar2 = copyRules(this,local_18->fFinalRules);
  this->fFinalRules = pUVar2;
  if (local_18->fUpToDate != '\0') {
    local_28[0] = U_ZERO_ERROR;
    complete(this,local_28);
  }
  return;
}

Assistant:

RuleBasedTimeZone::RuleBasedTimeZone(const RuleBasedTimeZone& source)
: BasicTimeZone(source), fInitialRule(source.fInitialRule->clone()),
  fHistoricTransitions(NULL), fUpToDate(FALSE) {
    fHistoricRules = copyRules(source.fHistoricRules);
    fFinalRules = copyRules(source.fFinalRules);
    if (source.fUpToDate) {
        UErrorCode status = U_ZERO_ERROR;
        complete(status);
    }
}